

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O1

void __thiscall
Lib::DArray<Kernel::Literal*>::
sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
          (DArray<Kernel::Literal*> *this,
          Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
          *comp)

{
  Literal *l2;
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
  *this_00;
  result_type_conflict1 rVar4;
  Comparison CVar5;
  int iVar6;
  Literal *aux;
  unsigned_long *puVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long *res;
  unsigned_long s;
  ulong local_58;
  uniform_int_distribution<int> local_48;
  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
  *local_40;
  unsigned_long local_38;
  
  if (1 < *(ulong *)this) {
    if ((sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>(Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>)
         ::ft == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>(Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>)
                                     ::ft), iVar6 != 0)) {
      DArray<Kernel::Literal_*>::
      sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
      ::ft._size = 0x20;
      DArray<Kernel::Literal_*>::
      sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
      ::ft._capacity = 0x20;
      puVar7 = (unsigned_long *)::operator_new(0x100,0x10);
      if (DArray<Kernel::Literal_*>::
          sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
          ::ft._capacity != 0) {
        memset(puVar7,0,DArray<Kernel::Literal_*>::
                        sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                        ::ft._capacity << 3);
      }
      DArray<Kernel::Literal_*>::
      sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
      ::ft._array = puVar7;
      __cxa_atexit(DArray<unsigned_long>::~DArray,
                   &DArray<Kernel::Literal_*>::
                    sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                    ::ft,&__dso_handle);
      __cxa_guard_release(&sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>(Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>)
                           ::ft);
    }
    s = *(long *)this - 1;
    DArray<unsigned_long>::ensure
              (&DArray<Kernel::Literal_*>::
                sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                ::ft,s);
    lVar8 = 0;
    local_58 = 0;
    local_40 = comp;
    do {
      local_48._M_param._M_b = (int)s - (int)local_58;
      local_48._M_param._M_a = 0;
      rVar4 = std::uniform_int_distribution<int>::operator()
                        (&local_48,&Random::_eng,&local_48._M_param);
      this_00 = local_40;
      uVar10 = (long)rVar4 + local_58;
      l2 = *(Literal **)(*(long *)(this + 0x10) + uVar10 * 8);
      uVar9 = local_58;
      local_38 = s;
      if (local_58 < uVar10) {
        do {
          CVar5 = Kernel::LiteralComparators::
                  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
                  ::compare(this_00,*(Literal **)(*(long *)(this + 0x10) + uVar9 * 8),l2);
          if ((uint)CVar5 < 2) {
            uVar9 = uVar9 + 1;
          }
          else if (CVar5 == LESS) {
            lVar1 = *(long *)(this + 0x10);
            uVar2 = *(undefined8 *)(lVar1 + uVar9 * 8);
            if (uVar10 == s) {
              *(undefined8 *)(lVar1 + uVar10 * 8) = uVar2;
              *(undefined8 *)(*(long *)(this + 0x10) + uVar9 * 8) =
                   *(undefined8 *)(*(long *)(this + 0x10) + -8 + uVar10 * 8);
              *(Literal **)(*(long *)(this + 0x10) + -8 + uVar10 * 8) = l2;
              uVar10 = uVar10 - 1;
            }
            else {
              *(undefined8 *)(lVar1 + uVar9 * 8) = *(undefined8 *)(lVar1 + s * 8);
              *(undefined8 *)(*(long *)(this + 0x10) + s * 8) = uVar2;
            }
            s = s - 1;
          }
        } while (uVar9 < uVar10);
      }
      while (puVar7 = DArray<Kernel::Literal_*>::
                      sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                      ::ft._array, uVar10 < s) {
        CVar5 = Kernel::LiteralComparators::
                Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
                ::compare(this_00,l2,*(Literal **)(*(long *)(this + 0x10) + 8 + uVar10 * 8));
        if ((uint)(CVar5 + GREATER) < 2) {
          *(undefined8 *)(*(long *)(this + 0x10) + uVar10 * 8) =
               *(undefined8 *)(*(long *)(this + 0x10) + 8 + uVar10 * 8);
          *(Literal **)(*(long *)(this + 0x10) + 8 + uVar10 * 8) = l2;
          uVar10 = uVar10 + 1;
        }
        else if (CVar5 == GREATER) {
          lVar1 = *(long *)(this + 0x10);
          uVar2 = *(undefined8 *)(lVar1 + s * 8);
          *(undefined8 *)(lVar1 + s * 8) = *(undefined8 *)(lVar1 + 8 + uVar10 * 8);
          *(undefined8 *)(*(long *)(this + 0x10) + 8 + uVar10 * 8) = uVar2;
          s = s - 1;
        }
      }
      if (uVar10 + 1 < local_38) {
        DArray<Kernel::Literal_*>::
        sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
        ::ft._array[lVar8] = uVar10 + 1;
        puVar7[lVar8 + 1] = local_38;
        lVar8 = lVar8 + 2;
      }
      s = uVar10 - 1;
      bVar3 = true;
      if (uVar10 == 0 || s <= local_58) {
        if (lVar8 == 0) {
          lVar8 = 0;
          bVar3 = false;
        }
        else {
          local_58 = DArray<Kernel::Literal_*>::
                     sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                     ::ft._array[lVar8 + -2];
          s = DArray<Kernel::Literal_*>::
              sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
              ::ft._array[lVar8 + -1];
          lVar8 = lVar8 + -2;
        }
      }
    } while (bVar3);
  }
  return;
}

Assistant:

void sortGen(Comparator comp)
  {
    if(_size <= 1) {
      return;
    }

    // array behaves as a stack of calls to quicksort
    static DArray<size_t> ft(32);

    size_t from = 0;
    size_t to=size()-1;
    ft.ensure(to);

    size_t p = 0; // pointer to the next element in ft
    for (;;) {
      ASS(from<size() && to<size()); //checking for underflows
      ASS(from<to);
      // invariant: from < to
      size_t m = from + Random::getInteger(to-from+1);
      C mid = (*this)[m];
      size_t l = from;
      size_t r = to;
      while (l < m) {
        switch ((Inversed?-1:1)*comp.compare((*this)[l],mid))
  	{
  	case EQUAL:
  	case LESS:
  	  l++;
  	  break;
  	case GREATER:
  	  if (m == r) {
  	    (*this)[m] = (*this)[l];
  	    (*this)[l] = (*this)[m-1];
  	    (*this)[m-1] = mid;
  	    m--;
  	    r--;
  	  }
  	  else {
  	    ASS(m < r);
  	    C aux = (*this)[l];
  	    (*this)[l] = (*this)[r];
  	    (*this)[r] = aux;
  	    r--;
  	  }
  	  break;
  	}
      }
      // l == m
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and literals in lits[r+1 ... to] are greater than lits[m]
      while (m < r) {
        switch ((Inversed?-1:1)*comp.compare(mid,(*this)[m+1]))
  	{
  	case LESS:
  	  {
  	    C aux = (*this)[r];
  	    (*this)[r] = (*this)[m+1];
  	    (*this)[m+1] = aux;
  	    r--;
  	  }
  	  break;
  	case EQUAL:
  	case GREATER:
  	  (*this)[m] = (*this)[m+1];
  	  (*this)[m+1] = mid;
  	  m++;
  	}
      }
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and all literals in lits[m+1 ... to] are greater than lits[m]
      if (m+1 < to) {
        ft[p++] = m+1;
        ft[p++] = to;
      }

      to = m-1;
      if (m!=0 && from < to) {
        continue;
      }
      if (p != 0) {
        p -= 2;
        ASS(p >= 0);
        from = ft[p];
        to = ft[p+1];
        continue;
      }
      return;
    }
  }